

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syrk.hpp
# Opt level: O2

void remora::bindings::
     syrk_impl<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::triangular_tag<false,false>>
               (ulong *e,long *m,undefined8 *alpha)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  double *pdVar4;
  size_t stride1;
  pointer __ptr;
  pointer __ptr_00;
  pointer __ptr_01;
  pointer pdVar5;
  double *pdVar6;
  ulong uVar7;
  size_t i0;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double *pdVar15;
  size_t j0_1;
  long lVar16;
  double *pdVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  aligned_allocator<double,_64UL> allocatorM;
  aligned_allocator<double,_64UL> allocatorE;
  double *local_100;
  ulong local_c8;
  type E_rights_trans;
  type E_lefts;
  
  __ptr = boost::alignment::aligned_allocator<double,_64UL>::allocate
                    (&allocatorE,0x18000,(const_void_pointer)0x0);
  __ptr_00 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (&allocatorE,0x18000,(const_void_pointer)0x0);
  __ptr_01 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (&allocatorM,0x2400,(const_void_pointer)0x0);
  uVar1 = *e;
  uVar2 = e[1];
  lVar3 = *m;
  pdVar4 = (double *)m[2];
  for (uVar19 = 0; uVar19 != uVar2 + 0x3ff >> 10; uVar19 = uVar19 + 1) {
    uVar13 = uVar2 + uVar19 * -0x400;
    if (0x3ff < uVar13) {
      uVar13 = 0x400;
    }
    local_c8 = 1;
    local_100 = pdVar4;
    for (uVar7 = 0; uVar7 != (uVar1 + 0x5f) / 0x60; uVar7 = uVar7 + 1) {
      uVar11 = uVar1 + uVar7 * -0x60;
      if (0x5f < uVar11) {
        uVar11 = 0x60;
      }
      E_lefts.m_leading_dimension = e[1];
      E_lefts.m_values =
           (double *)(E_lefts.m_leading_dimension * uVar7 * 0x60 * 8 + e[2] + uVar19 * 0x2000);
      E_lefts.m_size1 = uVar11;
      E_lefts.m_size2 = uVar13;
      pack_A_dense<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::syrk_block_size<double>>
                (&E_lefts,__ptr);
      uVar12 = 0;
      pdVar17 = local_100;
      uVar18 = uVar1;
      while( true ) {
        uVar14 = 0x60;
        if (uVar18 < 0x60) {
          uVar14 = uVar18;
        }
        if (uVar12 == local_c8) break;
        uVar20 = uVar1 + uVar12 * -0x60;
        if (0x5f < uVar20) {
          uVar20 = 0x60;
        }
        E_rights_trans.m_leading_dimension = e[1];
        E_rights_trans.m_values =
             (double *)
             (E_rights_trans.m_leading_dimension * uVar12 * 0x60 * 8 + e[2] + uVar19 * 0x2000);
        E_rights_trans.m_size1 = uVar13;
        E_rights_trans.m_size2 = uVar20;
        pack_B_dense<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::syrk_block_size<double>>
                  (&E_rights_trans,__ptr_00);
        if (uVar7 == uVar12) {
          pdVar5 = __ptr_01;
          for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
            for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
              pdVar5[uVar9] = 0.0;
            }
            pdVar5 = pdVar5 + 0x60;
          }
          mgemm<double,double,remora::bindings::syrk_block_size<double>>
                    (*alpha,uVar11,uVar20,uVar13,__ptr,__ptr_00,__ptr_01,0x60,1);
          lVar10 = 1;
          pdVar6 = pdVar17;
          pdVar5 = __ptr_01;
          for (uVar14 = 0; uVar14 != uVar11; uVar14 = uVar14 + 1) {
            pdVar15 = pdVar6;
            for (lVar16 = 0; lVar10 != lVar16; lVar16 = lVar16 + 1) {
              *pdVar15 = pdVar5[lVar16] + *pdVar15;
              pdVar15 = pdVar15 + lVar3;
            }
            lVar10 = lVar10 + 1;
            pdVar5 = pdVar5 + 0x60;
            pdVar6 = pdVar6 + 1;
          }
        }
        else {
          mgemm<double,double,remora::bindings::syrk_block_size<double>>
                    (*alpha,uVar11,uVar20,uVar13,__ptr,__ptr_00,
                     pdVar4 + uVar7 * 0x60 + uVar12 * 0x60 * lVar3,1,lVar3);
        }
        uVar12 = uVar12 + 1;
        uVar18 = uVar18 - 0x60;
        pdVar17 = pdVar17 + lVar3 * 0x60;
      }
      local_c8 = local_c8 + 1;
      local_100 = local_100 + 0x60;
    }
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return;
}

Assistant:

void syrk_impl(
	matrix_expression<E, cpu_tag> const& e,
	matrix_expression<Mat, cpu_tag>& m,
	typename Mat::value_type& alpha,
	Triangular t
){
	typedef typename E::value_type value_type;
	typedef syrk_block_size<value_type> block_size;

	static const std::size_t MC = block_size::lhs_block_size;
	static const std::size_t EC = block_size::rhs_k_size;

	//obtain uninitialized aligned storage
	boost::alignment::aligned_allocator<value_type,block_size::block::align> allocatorE;
	boost::alignment::aligned_allocator<typename Mat::value_type,block_size::block::align> allocatorM;
	value_type* E_left = allocatorE.allocate(MC * EC);
	value_type* E_right = allocatorE.allocate(MC * EC);
	auto M_diagonal_block = allocatorM.allocate(MC * MC);

	//figure out number of blocks to use
	const std::size_t  M = e().size1();
	const std::size_t  K = e().size2();
	const std::size_t Mb = (M+MC-1) / MC;//we split m in Mb x Mb blocks
	const std::size_t Eb = (K+EC-1) / EC;//we split B in Mb x Eb blocks

	//get access to raw storage of M
	auto storageM = m().raw_storage();
	auto Mpointer = storageM.values;
	const std::size_t stride1 = Mat::orientation::index_M(storageM.leading_dimension,1);
	const std::size_t stride2 = Mat::orientation::index_m(storageM.leading_dimension,1);

	for (std::size_t k = 0; k < Eb; ++k) {//column blocks of E
		std::size_t kc = std::min(EC, K - k * EC);
		for (std::size_t i = 0; i < Mb; ++i){//row-blocks of M
			std::size_t mc = std::min(MC, M - i * MC);
			//load block of the left E into memory
			auto E_lefts = subrange(e, i * MC, i * MC + mc, k*EC, k*EC + kc );
			pack_A_dense(E_lefts, E_left, block_size());

			std::size_t start_j = Triangular::is_upper? i : 0;
			std::size_t end_j = Triangular::is_upper? Mb : i+1;
			for(std::size_t j = start_j; j < end_j; ++j){//traverse over the blocks that are to be computed
				std::size_t mc2 = std::min(MC, M - j * MC);
				//load block of the right E into memory
				auto E_rights = subrange(e, j * MC, j * MC + mc2, k*EC, k*EC + kc );
				auto E_rights_trans = trans(E_rights);
				pack_B_dense(E_rights_trans, E_right, block_size());

				if(i==j){//diagonal block: we have to ensure that we only access elements on the diagonal
					for(std::size_t i0 = 0; i0 != mc; ++i0){
						for(std::size_t j0 = 0; j0 != mc2; ++j0){
							M_diagonal_block[i0*MC+j0] = 0.0;
						}
					}
					mgemm(
						mc, mc2, kc, alpha, E_left, E_right,
						M_diagonal_block, MC, 1, block_size()
					);
					auto M_diagonal = Mpointer + i * MC * stride1 + j * MC * stride2;
					for(std::size_t i0 = 0; i0 != mc; ++i0){
						std::size_t start_j0 = Triangular::is_upper? i0 : 0;
						std::size_t end_j0 = Triangular::is_upper? mc2 : i0+1;
						for(std::size_t j0 = start_j0; j0 < end_j0; ++j0){
							M_diagonal[i0*stride1+j0*stride2] += M_diagonal_block[i0*MC+j0];
						}
					}
				}else{
					mgemm(
						mc, mc2, kc, alpha, E_left, E_right,
						&Mpointer[i*MC * stride1 + j*MC * stride2], stride1, stride2, block_size()
					);
				}
			}
		}
	}
	//free storage
	allocatorE.deallocate(E_left,MC * EC);
	allocatorE.deallocate(E_right,MC * EC);
	allocatorM.deallocate(M_diagonal_block, MC * MC);
}